

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmidiin.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  undefined8 extraout_RAX;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  RtMidiIn *local_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  void *local_58;
  long lStack_50;
  long local_48;
  long local_40;
  double local_38;
  
  local_58 = (void *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  if (argc < 3) {
    local_80 = (RtMidiIn *)operator_new(0x10);
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"RtMidi Input Client","");
    RtMidiIn::RtMidiIn(local_80,0,&local_78,100);
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
    uVar1 = (**(code **)(*(long *)local_80 + 0x10))();
    uVar2 = 0;
    if (argc == 2) {
      uVar2 = atoi(argv[1]);
    }
    if (uVar2 < uVar1) {
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"RtMidi Input","");
      (*(code *)**(undefined8 **)local_80)(local_80,uVar2,&local_78);
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      (**(code **)(**(long **)(local_80 + 8) + 0x58))(*(long **)(local_80 + 8),0,0,0);
      done = false;
      signal(2,finish);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading MIDI from port ",0x17);
      (**(code **)(*(long *)local_80 + 0x18))(&local_78,local_80,0);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_78,local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ... quit with Ctrl-C.\n",0x17);
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      while (done == false) {
        local_38 = (double)MidiInApi::getMessage(*(vector **)(local_80 + 8));
        uVar1 = (uint)(lStack_50 - (long)local_58);
        if (0 < (int)uVar1) {
          uVar4 = 0;
          local_40 = lStack_50 - (long)local_58;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Byte ",5);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
            poVar3 = (ostream *)
                     std::ostream::operator<<(poVar3,(uint)*(byte *)((long)local_58 + uVar4));
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            uVar4 = uVar4 + 1;
          } while ((uVar1 & 0x7fffffff) != uVar4);
          if (0 < (int)local_40) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stamp = ",8);
            poVar3 = std::ostream::_M_insert<double>(local_38);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
          }
        }
        usleep(10000);
      }
      (**(code **)(*(long *)local_80 + 0x40))();
      if (local_58 != (void *)0x0) {
        operator_delete(local_58,local_48 - (long)local_58);
      }
      return 0;
    }
  }
  else {
    usage();
  }
  (**(code **)(*(long *)local_80 + 0x40))();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Invalid port specifier!\n",0x18);
  usage();
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main( int argc, char *argv[] )
{
  RtMidiIn *midiin = 0;
  std::vector<unsigned char> message;
  int nBytes, i;
  double stamp;

  // Minimal command-line check.
  if ( argc > 2 ) usage();

  // RtMidiIn constructor
  try {
    midiin = new RtMidiIn();
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    exit( EXIT_FAILURE );
  }

  // Check available ports vs. specified.
  unsigned int port = 0;
  unsigned int nPorts = midiin->getPortCount();
  if ( argc == 2 ) port = (unsigned int) atoi( argv[1] );
  if ( port >= nPorts ) {
    delete midiin;
    std::cout << "Invalid port specifier!\n";
    usage();
  }

  try {
    midiin->openPort( port );
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    goto cleanup;
  }

  // Don't ignore sysex, timing, or active sensing messages.
  midiin->ignoreTypes( false, false, false );

  // Install an interrupt handler function.
  done = false;
  (void) signal(SIGINT, finish);

  // Periodically check input queue.
  std::cout << "Reading MIDI from port " << midiin->getPortName() << " ... quit with Ctrl-C.\n";
  while ( !done ) {
    stamp = midiin->getMessage( &message );
    nBytes = message.size();
    for ( i=0; i<nBytes; i++ )
      std::cout << "Byte " << i << " = " << (int)message[i] << ", ";
    if ( nBytes > 0 )
      std::cout << "stamp = " << stamp << std::endl;

    // Sleep for 10 milliseconds.
    SLEEP( 10 );
  }

  // Clean up
 cleanup:
  delete midiin;

  return 0;
}